

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error
adios2_set_operation_parameter(adios2_variable *variable,size_t operation_id,char *key,char *value)

{
  char *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  VariableBase *variableBase;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [16];
  string *in_stack_ffffffffffffff88;
  adios2_variable *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"for adios2_variable, in call to adios2_set_operation_parameter",&local_49);
  adios2::helper::CheckForNullptr<adios2_variable>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,local_20,&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,local_28,&local_b1);
  adios2::core::VariableBase::SetOperationParameter(local_10,local_18,local_88,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_operation_parameter(adios2_variable *variable, const size_t operation_id,
                                            const char *key, const char *value)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_operation_parameter");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetOperationParameter(operation_id, key, value);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_operation_parameter"));
    }
}